

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

RequestBuilder * __thiscall restincurl::RequestBuilder::Header(RequestBuilder *this,char *value)

{
  headers_t pcVar1;
  
  if (value == (char *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x4d6,"RequestBuilder &restincurl::RequestBuilder::Header(const char *)");
  }
  if (this->is_built_ != true) {
    pcVar1 = (headers_t)
             curl_slist_append(((this->request_)._M_t.
                                super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
                                .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl)->
                               headers_);
    ((this->request_)._M_t.
     super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
     super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
     super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl)->headers_ = pcVar1;
    return this;
  }
  __assert_fail("!is_built_",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x4d7,"RequestBuilder &restincurl::RequestBuilder::Header(const char *)");
}

Assistant:

RequestBuilder& Header(const char *value) {
            assert(value);
            assert(!is_built_);
            request_->GetHeaders() = curl_slist_append(request_->GetHeaders(), value);
            return *this;
        }